

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void __thiscall EDCircles::JoinCircles(EDCircles *this)

{
  Circle *__src;
  int *noCircles;
  int iVar1;
  Circle *pCVar2;
  BufferManager *pBVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  void *__s;
  void *pvVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  uint N;
  ulong uVar11;
  ulong uVar12;
  Circle *circles;
  double *y;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong __n;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double error;
  double r;
  double yc;
  double xc;
  EllipseEquation Eq;
  uint local_14c;
  double local_148;
  double local_108;
  double local_100;
  double local_f8;
  double local_e0;
  double local_c8;
  ulong local_c0;
  double local_b8;
  double local_b0;
  EllipseEquation local_a8;
  EllipseEquation local_68;
  
  sortCircle(this->circles2,this->noCircles2);
  iVar1 = this->noCircles2;
  __n = (ulong)iVar1;
  if ((long)__n < 1) {
    uVar14 = (ulong)(iVar1 != 0);
    __s = operator_new__(-uVar14);
  }
  else {
    pCVar2 = this->circles2;
    pdVar10 = &pCVar2->minorAxisLength;
    uVar14 = __n;
    do {
      if (*(bool *)(pdVar10 + -2) == true) {
        ComputeEllipseCenterAndAxisLengths
                  ((EllipseEquation *)(pdVar10 + -10),(double *)(pdVar10 + -0x12),pdVar10 + -0x11,
                   pdVar10 + -1,pdVar10);
      }
      pdVar10 = pdVar10 + 0x13;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
    __s = operator_new__(__n);
    uVar14 = 0;
    if (0 < iVar1) {
      memset(__s,0,__n);
      pvVar7 = operator_new__(__n * 4);
      noCircles = &this->noCircles3;
      pdVar10 = &pCVar2[1].minorAxisLength;
      uVar12 = 1;
LAB_0010efe1:
      if (*(char *)((long)__s + uVar14) != '\x01') {
        __src = pCVar2 + uVar14;
        if (pCVar2[uVar14].isEllipse == true) {
          dVar17 = __src->minorAxisLength;
          dVar18 = __src->majorAxisLength;
        }
        else {
          dVar17 = __src->r;
          dVar18 = dVar17;
        }
        uVar13 = 0;
        if ((long)(uVar14 + 1) < (long)__n) {
          uVar13 = 0;
          pdVar8 = pdVar10;
          uVar9 = uVar12;
          do {
            if ((*(char *)((long)__s + uVar9) == '\0') &&
               (dVar19 = __src->xc - ((Circle *)(pdVar8 + -0x12))->xc,
               dVar20 = __src->yc - pdVar8[-0x11], SQRT(dVar19 * dVar19 + dVar20 * dVar20) <= 12.0))
            {
              if (*(bool *)(pdVar8 + -2) == true) {
                dVar19 = *pdVar8;
                dVar20 = pdVar8[-1];
              }
              else {
                dVar19 = pdVar8[-0x10];
                dVar20 = dVar19;
              }
              if ((ABS(dVar18 - dVar20) <= 6.0) && (ABS(dVar17 - dVar19) <= 6.0)) {
                *(int *)((long)pvVar7 + (long)(int)uVar13 * 4) = (int)uVar9;
                uVar13 = uVar13 + 1;
              }
            }
            uVar9 = uVar9 + 1;
            pdVar8 = pdVar8 + 0x13;
          } while (__n != uVar9);
        }
        local_100 = __src->xc;
        local_148 = __src->yc;
        local_f8 = __src->r;
        local_108 = __src->circleFitError;
        local_68.coeff[4] = 0.0;
        local_68.coeff[5] = 0.0;
        local_68.coeff[2] = 0.0;
        local_68.coeff[3] = 0.0;
        local_68.coeff[0] = 0.0;
        local_68.coeff[1] = 0.0;
        local_68.coeff[6] = 0.0;
        if (0 < (int)uVar13) {
          pBVar3 = this->bm;
          pdVar8 = pBVar3->x + pBVar3->index;
          y = pBVar3->y + pBVar3->index;
          uVar11 = (ulong)__src->noPixels;
          memcpy(pdVar8,__src->x,uVar11 << 3);
          memcpy(y,__src->y,uVar11 << 3);
          bVar4 = true;
          uVar15 = 0;
          uVar9 = 0;
LAB_0010f1b6:
          bVar6 = false;
          local_14c = (uint)uVar11;
          local_c0 = uVar9;
          do {
            uVar15 = uVar15 + 1;
            lVar16 = (long)*(int *)((long)pvVar7 + uVar15 * 4 + -4);
            memcpy(pdVar8 + (int)local_14c,pCVar2[lVar16].x,(long)pCVar2[lVar16].noPixels << 3);
            memcpy(y + (int)local_14c,pCVar2[lVar16].y,(long)pCVar2[lVar16].noPixels << 3);
            N = local_14c + pCVar2[lVar16].noPixels;
            uVar11 = (ulong)N;
            if (((bVar4) && (__src->isEllipse == false)) && (pCVar2[lVar16].isEllipse == false)) {
              local_c8 = 10000000000.0;
              CircleFit(pdVar8,y,N,local_a8.coeff,&local_b0,&local_b8,&local_c8);
              if (2.0 < local_c8) goto LAB_0010f2aa;
              *(undefined1 *)((long)__s + lVar16) = 1;
              local_100 = local_a8.coeff[0];
              local_148 = local_b0;
              local_f8 = local_b8;
              bVar6 = true;
              local_14c = N;
              local_108 = local_c8;
            }
            else {
LAB_0010f2aa:
              local_a8.coeff[4] = 0.0;
              local_a8.coeff[5] = 0.0;
              local_a8.coeff[2] = 0.0;
              local_a8.coeff[3] = 0.0;
              local_a8.coeff[0] = 0.0;
              local_a8.coeff[1] = 0.0;
              local_a8.coeff[6] = 0.0;
              bVar5 = EllipseFit(pdVar8,y,N,&local_a8,1);
              if (bVar5) {
                uVar9 = (ulong)N;
                dVar17 = ComputeEllipseError(&local_a8,pdVar8,y,N);
                if (dVar17 <= 2.0) goto LAB_0010f38f;
              }
            }
            if (uVar15 == uVar13) {
              circles = this->circles3;
              if (!bVar6) {
                if ((local_c0 & 1) == 0) goto LAB_0010f54e;
                goto LAB_0010f517;
              }
              iVar1 = *noCircles;
              circles[iVar1].xc = local_100;
              circles[iVar1].yc = local_148;
              circles[iVar1].r = local_f8;
              circles[iVar1].circleFitError = local_108;
              circles[iVar1].coverRatio = 0.0 / (local_f8 * 6.283185307179586);
              circles[iVar1].x = (double *)0x0;
              (&circles[iVar1].x)[1] = (double *)0x0;
              circles[iVar1].noPixels = 0;
              iVar1 = *noCircles;
              circles[iVar1].isEllipse = false;
              *noCircles = iVar1 + 1;
              goto LAB_0010f595;
            }
          } while( true );
        }
        circles = this->circles3;
LAB_0010f54e:
        memcpy(circles + *noCircles,__src,0x98);
        *noCircles = *noCircles + 1;
      }
      goto LAB_0010f595;
    }
  }
  uVar12 = 0xffffffffffffffff;
  if ((char)uVar14 == '\0') {
    uVar12 = __n << 2;
  }
  pvVar7 = operator_new__(uVar12);
LAB_0010f5d9:
  operator_delete__(__s);
  operator_delete__(pvVar7);
  return;
LAB_0010f38f:
  *(undefined1 *)((long)__s + lVar16) = 1;
  local_68.coeff[6] = local_a8.coeff[6];
  local_68.coeff[0] = local_a8.coeff[0];
  local_68.coeff[1] = local_a8.coeff[1];
  local_68.coeff[2] = local_a8.coeff[2];
  local_68.coeff[3] = local_a8.coeff[3];
  local_68.coeff[4] = local_a8.coeff[4];
  local_68.coeff[5] = local_a8.coeff[5];
  uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
  bVar4 = false;
  local_e0 = dVar17;
  if (uVar15 == uVar13) goto code_r0x0010f40b;
  goto LAB_0010f1b6;
code_r0x0010f40b:
  circles = this->circles3;
LAB_0010f517:
  addCircle(circles,noCircles,local_100,local_148,local_f8,local_108,&local_68,local_e0,
            (double *)0x0,(double *)0x0,0);
LAB_0010f595:
  uVar14 = uVar14 + 1;
  uVar12 = uVar12 + 1;
  pdVar10 = pdVar10 + 0x13;
  if (uVar14 == __n) goto LAB_0010f5d9;
  goto LAB_0010efe1;
}

Assistant:

void EDCircles::JoinCircles()
{
	// Sort the circles wrt their radius
	sortCircle(circles2, noCircles2);

	int noCircles = noCircles2;
	Circle *circles = circles2;

	for (int i = 0; i<noCircles; i++) {
		if (circles[i].isEllipse) {
			ComputeEllipseCenterAndAxisLengths(&circles[i].eq, &circles[i].xc, &circles[i].yc, &circles[i].majorAxisLength, &circles[i].minorAxisLength);
		} //end-if
	} //end-for

	bool *taken = new bool[noCircles];
	for (int i = 0; i<noCircles; i++) taken[i] = false;

	int *candidateCircles = new int[noCircles];
	int noCandidateCircles;

	for (int i = 0; i<noCircles; i++) {
		if (taken[i]) continue;

		// Current arc
		double majorAxisLength, minorAxisLength;

		if (circles[i].isEllipse) {
			majorAxisLength = circles[i].majorAxisLength;
			minorAxisLength = circles[i].minorAxisLength;

		}
		else {
			majorAxisLength = circles[i].r;
			minorAxisLength = circles[i].r;
		} //end-else

		  // Find other circles to join with
		noCandidateCircles = 0;

		for (int j = i + 1; j<noCircles; j++) {
			if (taken[j]) continue;

#define JOINED_SHORT_ARC_ERROR_THRESHOLD  2 // 2.5
#define AXIS_LENGTH_DIFF_THRESHOLD     6 //(JOINED_SHORT_ARC_ERROR_THRESHOLD*2+1)
#define CENTER_DISTANCE_THRESHOLD      12 //(AXIS_LENGTH_DIFF_THRESHOLD*2)

			double dx = circles[i].xc - circles[j].xc;
			double dy = circles[i].yc - circles[j].yc;
			double centerDistance = sqrt(dx*dx + dy*dy);
			if (centerDistance > CENTER_DISTANCE_THRESHOLD) continue;

			double diff1, diff2;
			if (circles[j].isEllipse) {
				diff1 = fabs(majorAxisLength - circles[j].majorAxisLength);
				diff2 = fabs(minorAxisLength - circles[j].minorAxisLength);

			}
			else {
				diff1 = fabs(majorAxisLength - circles[j].r);
				diff2 = fabs(minorAxisLength - circles[j].r);
			} //end-else

			if (diff1 > AXIS_LENGTH_DIFF_THRESHOLD) continue;
			if (diff2 > AXIS_LENGTH_DIFF_THRESHOLD) continue;

			// Add to candidates
			candidateCircles[noCandidateCircles] = j;
			noCandidateCircles++;
		} //end-for

		  // Try to join the current arc with the candidate arc (if there is one)
		double XC = circles[i].xc;
		double YC = circles[i].yc;
		double R = circles[i].r;

		double CircleFitError = circles[i].circleFitError;
		bool CircleFitValid = false;

		EllipseEquation Eq;
		double EllipseFitError;
		bool EllipseFitValid = false;

		if (noCandidateCircles > 0) {
			int noPixels = circles[i].noPixels;
			double *x = bm->getX();
			double *y = bm->getY();
			memcpy(x, circles[i].x, noPixels * sizeof(double));
			memcpy(y, circles[i].y, noPixels * sizeof(double));

			for (int j = 0; j<noCandidateCircles; j++) {
				int CandidateArcNo = candidateCircles[j];

				int noPixelsSave = noPixels;
				memcpy(x + noPixels, circles[CandidateArcNo].x, circles[CandidateArcNo].noPixels * sizeof(double));
				memcpy(y + noPixels, circles[CandidateArcNo].y, circles[CandidateArcNo].noPixels * sizeof(double));
				noPixels += circles[CandidateArcNo].noPixels;

				bool circleFitOK = false;
				if (EllipseFitValid == false && circles[i].isEllipse == false && circles[CandidateArcNo].isEllipse == false) {
					double xc, yc, r, error = 1e10;
					CircleFit(x, y, noPixels, &xc, &yc, &r, &error);

					if (error <= JOINED_SHORT_ARC_ERROR_THRESHOLD) {
						taken[CandidateArcNo] = true;

						XC = xc;
						YC = yc;
						R = r;
						CircleFitError = error;

						circleFitOK = true;
						CircleFitValid = true;
					} //end-if
				} // end-if

				bool ellipseFitOK = false;
				if (circleFitOK == false) {
					// Try to fit an ellipse
					double error = 1e10;
					EllipseEquation eq;
					if (EllipseFit(x, y, noPixels, &eq)) {
						error = ComputeEllipseError(&eq, x, y, noPixels);
					} //end-if

					if (error <= JOINED_SHORT_ARC_ERROR_THRESHOLD) {
						taken[CandidateArcNo] = true;

						Eq = eq;
						EllipseFitError = error;

						ellipseFitOK = true;
						EllipseFitValid = true;
						CircleFitValid = false;
					} // end-if
				} //end-if

				if (circleFitOK == false && ellipseFitOK == false) {
					noPixels = noPixelsSave;
				} //end-if
			} // end-for
		} //end-if

		// Add the new circle/ellipse to circles2
		if (CircleFitValid) {
			addCircle(circles3, noCircles3, XC, YC, R, CircleFitError, NULL, NULL, 0);

		}
		else if (EllipseFitValid) {
			addCircle(circles3, noCircles3, XC, YC, R, CircleFitError, &Eq, EllipseFitError, NULL, NULL, 0);

		}
		else {
			circles3[noCircles3] = circles[i];
			noCircles3++;
		} //end-else
	} //end-for

	delete[] taken;
	delete[] candidateCircles;
}